

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_String * tt_name_ascii_from_other(TT_Name entry,FT_Memory memory)

{
  FT_Byte *pFVar1;
  undefined8 in_RAX;
  FT_String *pFVar2;
  ulong uVar3;
  FT_Byte FVar4;
  FT_String *pFVar5;
  ulong uVar6;
  ulong uVar7;
  FT_Error error;
  
  error = (FT_Error)((ulong)in_RAX >> 0x20);
  pFVar1 = entry->string;
  uVar6 = (ulong)entry->stringLength;
  pFVar2 = (FT_String *)ft_mem_realloc(memory,1,0,uVar6 + 1,(void *)0x0,&error);
  pFVar5 = (FT_String *)0x0;
  if (error == 0) {
    for (uVar3 = 0;
        (uVar7 = uVar6, uVar6 != uVar3 && (FVar4 = pFVar1[uVar3], uVar7 = uVar3, FVar4 != '\0'));
        uVar3 = uVar3 + 1) {
      if ((char)FVar4 < ' ') {
        FVar4 = '?';
      }
      pFVar2[uVar3] = FVar4;
    }
    pFVar2[uVar7] = '\0';
    pFVar5 = pFVar2;
  }
  return pFVar5;
}

Assistant:

static FT_String*
  tt_name_ascii_from_other( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength;

    if ( FT_NEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = *read++;

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }